

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall Chainstate::UpdateTip(Chainstate *this,CBlockIndex *pindexNew)

{
  uint uVar1;
  CChainParams *params;
  uint256 *puVar2;
  Notifications *pNVar3;
  bool bVar4;
  ThresholdState TVar5;
  CCoinsViewCache *coins_tip;
  Chainstate *pCVar6;
  long in_FS_OFFSET;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warning_messages;
  UniqueLock<GlobalMutex> criticalblock19;
  WarningBitsConditionChecker checker;
  uint local_13c;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_138;
  long *local_118;
  long local_110;
  long local_108 [2];
  string local_f8;
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  coins_tip = CoinsTip(this);
  params = (this->m_chainman->m_options).chainparams;
  pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
  if (pCVar6 == this) {
    if (this->m_mempool != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated(this->m_mempool,1);
    }
    local_98._0_8_ = &g_best_block_mutex;
    local_98[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
    puVar2 = pindexNew->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
LAB_004084a0:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    g_best_block.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    g_best_block.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    g_best_block.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    g_best_block.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
    local_138.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
    if (!bVar4) {
      local_13c = 0;
      do {
        local_58._M_string_length = (size_type)this->m_chainman;
        local_58._M_dataplus._M_p = (pointer)&PTR_Condition_00b3a4d0;
        local_58.field_2._M_allocated_capacity._0_4_ = local_13c;
        if (0x1c < local_13c) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004086ab;
          std::__throw_out_of_range_fmt
                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)local_13c,0x1d
                    );
          goto LAB_004084a0;
        }
        TVar5 = AbstractThresholdConditionChecker::GetStateFor
                          ((AbstractThresholdConditionChecker *)&local_58,pindexNew,
                           &params->consensus,
                           (((ChainstateManager *)local_58._M_string_length)->m_warningcache).
                           _M_elems + (int)local_13c);
        if ((TVar5 & ~STARTED) == LOCKED_IN) {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"Unknown new rules activated (versionbit %i)","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_b8._M_dataplus._M_p = local_d8 + 0x30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_d8 + 0x20),"Unknown new rules activated (versionbit %i)","")
            ;
          }
          else {
            local_f8._M_dataplus._M_p = "Unknown new rules activated (versionbit %i)";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_d8 + 0x20),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&local_f8);
          }
          tinyformat::format<int>
                    ((bilingual_str *)local_98,(bilingual_str *)local_d8,(int *)&local_13c);
          if (local_b8._M_dataplus._M_p != local_d8 + 0x30) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
          if (TVar5 == ACTIVE) {
            pNVar3 = (this->m_chainman->m_options).notifications;
            (*pNVar3->_vptr_Notifications[5])(pNVar3,0,local_98);
          }
          else {
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                      (&local_138,(value_type *)local_98);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_p != &local_68) {
            operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._0_8_ != &local_88) {
            operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
          }
        }
        uVar1 = local_13c + 1;
        bVar4 = (int)local_13c < 0x1c;
        local_13c = uVar1;
      } while (bVar4);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"UpdateTip","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,", ","");
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_118,local_110 + (long)local_118);
    local_b8._M_dataplus._M_p = local_d8 + 0x30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_d8 + 0x20),local_118,local_110 + (long)local_118);
    util::
    Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str,util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>(std::vector<bilingual_str,std::allocator<bilingual_str>>const&,bilingual_str_const&)::_lambda(auto:1_const&)_1_>
              (local_98,(util *)&local_138,local_d8);
    UpdateTipLog(coins_tip,pindexNew,params,&local_58,&local_f8,(string *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
    }
    if (local_b8._M_dataplus._M_p != local_d8 + 0x30) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_138);
  }
  else if ((pindexNew->nHeight * 0x26e978d5 + 0x10624d0U >> 4 | pindexNew->nHeight * 0x50000000) <
           0x20c49b) {
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"UpdateTip","");
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"[background validation] ","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    UpdateTipLog(coins_tip,pindexNew,params,(string *)local_98,(string *)local_d8,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004086ab:
  __stack_chk_fail();
}

Assistant:

void Chainstate::UpdateTip(const CBlockIndex* pindexNew)
{
    AssertLockHeld(::cs_main);
    const auto& coins_tip = this->CoinsTip();

    const CChainParams& params{m_chainman.GetParams()};

    // The remainder of the function isn't relevant if we are not acting on
    // the active chainstate, so return if need be.
    if (this != &m_chainman.ActiveChainstate()) {
        // Only log every so often so that we don't bury log messages at the tip.
        constexpr int BACKGROUND_LOG_INTERVAL = 2000;
        if (pindexNew->nHeight % BACKGROUND_LOG_INTERVAL == 0) {
            UpdateTipLog(coins_tip, pindexNew, params, __func__, "[background validation] ", "");
        }
        return;
    }

    // New best block
    if (m_mempool) {
        m_mempool->AddTransactionsUpdated(1);
    }

    {
        LOCK(g_best_block_mutex);
        g_best_block = pindexNew->GetBlockHash();
        g_best_block_cv.notify_all();
    }

    std::vector<bilingual_str> warning_messages;
    if (!m_chainman.IsInitialBlockDownload()) {
        const CBlockIndex* pindex = pindexNew;
        for (int bit = 0; bit < VERSIONBITS_NUM_BITS; bit++) {
            WarningBitsConditionChecker checker(m_chainman, bit);
            ThresholdState state = checker.GetStateFor(pindex, params.GetConsensus(), m_chainman.m_warningcache.at(bit));
            if (state == ThresholdState::ACTIVE || state == ThresholdState::LOCKED_IN) {
                const bilingual_str warning = strprintf(_("Unknown new rules activated (versionbit %i)"), bit);
                if (state == ThresholdState::ACTIVE) {
                    m_chainman.GetNotifications().warningSet(kernel::Warning::UNKNOWN_NEW_RULES_ACTIVATED, warning);
                } else {
                    warning_messages.push_back(warning);
                }
            }
        }
    }
    UpdateTipLog(coins_tip, pindexNew, params, __func__, "",
                 util::Join(warning_messages, Untranslated(", ")).original);
}